

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_inl.h
# Opt level: O0

int16_t WebRtcSpl_SatW32ToW16(int32_t value32)

{
  undefined2 local_e;
  int16_t out16;
  int32_t value32_local;
  
  local_e = (int16_t)value32;
  if (value32 < 0x8000) {
    if (value32 < -0x8000) {
      local_e = -0x8000;
    }
  }
  else {
    local_e = 0x7fff;
  }
  return local_e;
}

Assistant:

static __inline int16_t WebRtcSpl_SatW32ToW16(int32_t value32) {
  int16_t out16 = (int16_t) value32;

  if (value32 > 32767)
    out16 = 32767;
  else if (value32 < -32768)
    out16 = -32768;

  return out16;
}